

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O1

void __thiscall
booster::locale::boundary::details::
boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
::update_current(boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *this,size_t pos)

{
  mapping_type *pmVar1;
  element_type *peVar2;
  long lVar3;
  size_t sVar4;
  difference_type __d;
  pointer pbVar5;
  pointer pbVar6;
  size_t sVar7;
  pointer pbVar8;
  
  pmVar1 = this->map_;
  peVar2 = (pmVar1->index_).
           super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  lVar3 = (long)(peVar2->
                super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                )._M_impl.super__Vector_impl_data._M_start;
  pbVar6 = (peVar2->
           super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  sVar7 = (long)pbVar6 - lVar3 >> 4;
  pbVar6 = pbVar6 + -1;
  pbVar8 = (pointer)(lVar3 + pos * 0x10);
  if (sVar7 == pos) {
    pbVar8 = pbVar6;
  }
  pbVar5 = (pointer)(this->current_ * 0x10 + lVar3);
  if (sVar7 == this->current_) {
    pbVar5 = pbVar6;
  }
  sVar7 = pbVar8->offset;
  sVar4 = pbVar5->offset;
  this->current_ = pos;
  (this->value_).iterator_._M_current = (this->value_).iterator_._M_current + (sVar7 - sVar4);
  peVar2 = (pmVar1->index_).
           super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  lVar3 = (long)(peVar2->
                super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(peVar2->
            super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
            )._M_impl.super__Vector_impl_data._M_finish - lVar3 >> 4 != pos) {
    (this->value_).rule_ = *(rule_type *)(lVar3 + 8 + pos * 0x10);
  }
  return;
}

Assistant:

void update_current(size_t pos)
                    {
                        std::ptrdiff_t diff = get_offset(pos) - get_offset(current_);
                        base_iterator i=value_.iterator();
                        std::advance(i,diff);
                        current_ = pos;
                        value_.iterator(i);
                        update_rule();
                    }